

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O3

pair<double,_double> __thiscall
manager::Manager<ttt::Board>::Match
          (Manager<ttt::Board> *this,longlong bot_id1,longlong bot_id2,int count)

{
  Board *pBVar1;
  double dVar2;
  undefined1 auVar3 [12];
  ulong uVar4;
  long *plVar5;
  int iVar6;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> _Var7;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> _Var8;
  Board *this_00;
  long *plVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined8 uVar14;
  undefined1 auVar13 [16];
  pair<double,_double> pVar15;
  IBot<ttt::Board> *bs [2];
  IMove move;
  undefined1 local_98 [32];
  long *local_78 [3];
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_60;
  _Node_iterator_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false> local_58;
  IMove local_50;
  Manager<ttt::Board> *local_48;
  longlong local_40;
  longlong local_38;
  
  local_48 = this;
  local_40 = bot_id2;
  local_38 = bot_id1;
  _Var7._M_cur = (__node_type *)
                 std::
                 _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->bots)._M_h,&local_38);
  _Var8._M_cur = (__node_type *)
                 std::
                 _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->bots)._M_h,&local_40);
  if (count < 1) {
    local_98._0_16_ = ZEXT816(0);
  }
  else {
    uVar11 = 0;
    local_98._0_16_ = ZEXT816(0);
    local_60._M_cur = _Var8._M_cur;
    local_58._M_cur = _Var7._M_cur;
    do {
      this_00 = (Board *)operator_new(10);
      pBVar1 = local_48->game;
      *(undefined8 *)(this_00->board)._M_elems = *(undefined8 *)(pBVar1->board)._M_elems;
      *(undefined2 *)((this_00->board)._M_elems[2]._M_elems + 2) =
           *(undefined2 *)((pBVar1->board)._M_elems[2]._M_elems + 2);
      local_78[0] = (long *)0x0;
      local_78[1] = (long *)0x0;
      plVar9 = (long *)(**(code **)(**(long **)(*(long *)((long)&((_Var7._M_cur)->
                                                                                                                                  
                                                  super__Hash_node_value<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>
                                                  ._M_storage._M_storage + 8) + 8) + 0x10))();
      uVar10 = uVar11 & 1;
      local_78[uVar10] = plVar9;
      plVar9 = (long *)(**(code **)(**(long **)(*(long *)((long)&((_Var8._M_cur)->
                                                                                                                                  
                                                  super__Hash_node_value<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>
                                                  ._M_storage._M_storage + 8) + 8) + 0x10))();
      local_78[uVar10 ^ 1] = plVar9;
      iVar6 = ttt::Board::GetStatus(this_00);
      plVar5 = local_78[1];
      plVar9 = local_78[0];
      while (iVar6 == -1) {
        local_50 = (**(code **)(*plVar9 + 0x18))(plVar9);
        ttt::Board::ApplyMove(this_00,&local_50);
        (**(code **)(*plVar5 + 0x20))(plVar5,&local_50);
        iVar6 = ttt::Board::GetStatus(this_00);
        _Var8._M_cur = local_60._M_cur;
        _Var7._M_cur = local_58._M_cur;
        if (iVar6 != -1) break;
        local_50 = (**(code **)(*plVar5 + 0x18))(plVar5);
        ttt::Board::ApplyMove(this_00,&local_50);
        (**(code **)(*plVar9 + 0x20))(plVar9,&local_50);
        iVar6 = ttt::Board::GetStatus(this_00);
        _Var8._M_cur = local_60._M_cur;
        _Var7._M_cur = local_58._M_cur;
      }
      if (iVar6 == 1) {
        if (uVar10 != 0) goto LAB_001485c7;
LAB_001485af:
        dVar2 = (double)local_98._0_8_ + 1.0;
LAB_001485bc:
        uVar4 = (ulong)local_98._8_8_ >> 0x20;
        local_98._8_4_ = (int)local_98._8_8_;
        local_98._0_8_ = dVar2;
        local_98._12_4_ = (int)uVar4;
      }
      else {
        if (iVar6 == 0) {
          dVar2 = (double)local_98._0_8_ + 0.5;
          local_98._8_8_ = (double)local_98._8_8_ + 0.5;
          goto LAB_001485bc;
        }
        if (uVar10 != 0) goto LAB_001485af;
LAB_001485c7:
        local_98._8_8_ = (double)local_98._8_8_ + 1.0;
      }
      if (local_78[0] != (long *)0x0) {
        (**(code **)(*local_78[0] + 8))();
      }
      if (local_78[1] != (long *)0x0) {
        (**(code **)(*local_78[1] + 8))();
      }
      operator_delete(this_00);
      uVar11 = uVar11 + 1;
    } while (uVar11 != count);
  }
  dVar2 = (double)count;
  auVar12._8_4_ = SUB84(dVar2,0);
  auVar12._0_8_ = dVar2;
  auVar12._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar12 = divpd(local_98._0_16_,auVar12);
  uVar14 = 0;
  pVar15 = MM::operator()((MM *)local_78,
                          *(double *)
                           (*(long *)((long)&((_Var7._M_cur)->
                                             super__Hash_node_value<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>
                                             ._M_storage._M_storage + 8) + 0x10),
                          *(double *)
                           (*(long *)((long)&((_Var8._M_cur)->
                                             super__Hash_node_value<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>
                                             ._M_storage._M_storage + 8) + 0x10),auVar12._0_8_);
  *(double *)
   (*(long *)((long)&((_Var7._M_cur)->
                     super__Hash_node_value<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>
                     ._M_storage._M_storage + 8) + 0x10) = pVar15.first;
  *(double *)
   (*(long *)((long)&((_Var8._M_cur)->
                     super__Hash_node_value<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_long_long,_manager::Bot<ttt::Board>_*>_>
                     ._M_storage._M_storage + 8) + 0x10) = pVar15.second;
  auVar3._4_8_ = uVar14;
  auVar3._0_4_ = auVar12._4_4_;
  auVar13._0_8_ = auVar3._0_8_ << 0x20;
  auVar13._8_4_ = auVar12._8_4_;
  auVar13._12_4_ = auVar12._12_4_;
  pVar15.second = auVar13._8_8_;
  pVar15.first = auVar12._0_8_;
  return pVar15;
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}